

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

Ptr __thiscall
core::image::raw_to_byte_image(image *this,ConstPtr *image,uint16_t vmin,uint16_t vmax)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int height;
  int chans;
  uint uVar4;
  invalid_argument *this_00;
  TypedImageBase<unsigned_char> *this_01;
  ImageBase *pIVar5;
  TypedImageBase<unsigned_short> *this_02;
  element_type *this_03;
  unsigned_short *puVar6;
  element_type *this_04;
  uchar *puVar7;
  uint uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar9;
  int local_34;
  uint16_t value;
  int i;
  uint16_t local_1c;
  uint16_t local_1a;
  uint16_t vmax_local;
  ConstPtr *pCStack_18;
  uint16_t vmin_local;
  ConstPtr *image_local;
  Ptr *img;
  
  local_1c = vmax;
  local_1a = vmin;
  pCStack_18 = image;
  image_local = (ConstPtr *)this;
  bVar2 = std::operator==(image,(nullptr_t)0x0);
  if (bVar2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  Image<unsigned_char>::create();
  this_01 = &std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<unsigned_char>;
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  height = ImageBase::height(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  chans = ImageBase::channels(pIVar5);
  TypedImageBase<unsigned_char>::allocate(this_01,iVar3,height,chans);
  local_34 = 0;
  while( true ) {
    this_02 = &std::
               __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<unsigned_short>;
    iVar3 = TypedImageBase<unsigned_short>::get_value_amount(this_02);
    if (iVar3 <= local_34) break;
    this_03 = std::
              __shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    puVar6 = Image<unsigned_short>::at(this_03,local_34);
    puVar6 = std::max<unsigned_short>(&local_1a,puVar6);
    puVar6 = std::min<unsigned_short>(&local_1c,puVar6);
    uVar1 = *puVar6;
    uVar8 = (uint)local_1a;
    uVar4 = (uint)local_1c;
    this_04 = std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    puVar7 = Image<unsigned_char>::at(this_04,local_34);
    *puVar7 = (uchar)(int)((double)((int)(((double)(int)(uVar1 - uVar8) * 255.0) /
                                         (double)(int)(uVar4 - uVar8)) & 0xffff) + 0.5);
    local_34 = local_34 + 1;
  }
  PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ByteImage::Ptr
raw_to_byte_image (RawImage::ConstPtr image, uint16_t vmin, uint16_t vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        uint16_t value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0 * static_cast<double>(value - vmin)
            / static_cast<double>(vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5);
    }
    return img;
}